

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O0

void __thiscall mnf::Manifold::display(Manifold *this)

{
  ostream *this_00;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  Manifold *local_10;
  Manifold *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  (*this->_vptr_Manifold[5])(local_30,this,local_50,1);
  this_00 = std::operator<<((ostream *)&std::cout,local_30);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void Manifold::display() const { std::cout << description() << std::endl; }